

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void LockedPoolManager::CreateInstance(void)

{
  int iVar1;
  LockedPoolManager *this;
  long in_FS_OFFSET;
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> allocator;
  PosixLockedPageAllocator *in_stack_ffffffffffffffb8;
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
  *in_stack_ffffffffffffffc8;
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (LockedPoolManager *)operator_new(0x10);
  PosixLockedPageAllocator::PosixLockedPageAllocator(in_stack_ffffffffffffffb8);
  std::unique_ptr<LockedPageAllocator,std::default_delete<LockedPageAllocator>>::
  unique_ptr<std::default_delete<LockedPageAllocator>,void>
            ((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)
             in_stack_ffffffffffffffb8,(pointer)0x3c5b71);
  if (CreateInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&CreateInstance()::instance);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = local_18;
      std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::unique_ptr
                ((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)
                 in_stack_ffffffffffffffb8,
                 (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)
                 0x3c5b9f);
      LockedPoolManager(this,in_stack_ffffffffffffffc8);
      std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::~unique_ptr
                (in_stack_ffffffffffffffc8);
      __cxa_atexit(~LockedPoolManager,&CreateInstance::instance,&__dso_handle);
      __cxa_guard_release(&CreateInstance()::instance);
    }
  }
  _instance = &CreateInstance::instance;
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::~unique_ptr
            (in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LockedPoolManager::CreateInstance()
{
    // Using a local static instance guarantees that the object is initialized
    // when it's first needed and also deinitialized after all objects that use
    // it are done with it.  I can think of one unlikely scenario where we may
    // have a static deinitialization order/problem, but the check in
    // LockedPoolManagerBase's destructor helps us detect if that ever happens.
#ifdef WIN32
    std::unique_ptr<LockedPageAllocator> allocator(new Win32LockedPageAllocator());
#else
    std::unique_ptr<LockedPageAllocator> allocator(new PosixLockedPageAllocator());
#endif
    static LockedPoolManager instance(std::move(allocator));
    LockedPoolManager::_instance = &instance;
}